

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_vmask_sse4.c
# Opt level: O0

void blend_a64_vmask_w16n_sse4_1
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,int w,int h)

{
  uint in_ESI;
  uint8_t *puVar1;
  long in_RDI;
  uint8_t *in_R8;
  uint in_R9D;
  __m128i alVar2;
  __m128i v_res_b;
  __m128i v_resh_w;
  __m128i v_resl_w;
  __m128i v_m1_w;
  __m128i v_m0_w;
  int c;
  __m128i v_maxval_w;
  int local_dc;
  __m128i *v_m1_w_00;
  __m128i *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  long local_98;
  
  v_m1_w_00 = (__m128i *)0x40004000400040;
  local_98 = in_RDI;
  do {
    for (local_dc = 0; local_dc < (int)v_res_b[0]; local_dc = local_dc + 0x10) {
      blend_8(in_R8,(uint8_t *)CONCAT44(in_R9D,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38,
              v_m1_w_00);
      puVar1 = in_R8 + (long)local_dc + 8;
      alVar2 = blend_8(in_R8,(uint8_t *)CONCAT44(in_R9D,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff38,v_m1_w_00);
      alVar2[0] = (longlong)puVar1;
      xx_storeu_128((void *)(local_98 + local_dc),alVar2);
    }
    local_98 = local_98 + (ulong)in_ESI;
    in_R8 = in_R8 + in_R9D;
    v_res_b[1]._0_4_ = (int)v_res_b[1] + -1;
  } while ((int)v_res_b[1] != 0);
  return;
}

Assistant:

static void blend_a64_vmask_w16n_sse4_1(uint8_t *dst, uint32_t dst_stride,
                                        const uint8_t *src0,
                                        uint32_t src0_stride,
                                        const uint8_t *src1,
                                        uint32_t src1_stride,
                                        const uint8_t *mask, int w, int h) {
  const __m128i v_maxval_w = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);

  do {
    int c;
    const __m128i v_m0_w = _mm_set1_epi16(*mask);
    const __m128i v_m1_w = _mm_sub_epi16(v_maxval_w, v_m0_w);
    for (c = 0; c < w; c += 16) {
      const __m128i v_resl_w = blend_8(src0 + c, src1 + c, &v_m0_w, &v_m1_w);
      const __m128i v_resh_w =
          blend_8(src0 + c + 8, src1 + c + 8, &v_m0_w, &v_m1_w);

      const __m128i v_res_b = _mm_packus_epi16(v_resl_w, v_resh_w);

      xx_storeu_128(dst + c, v_res_b);
    }
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += 1;
  } while (--h);
}